

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

FT_Error T1_Set_MM_WeightVector(T1_Face face,FT_UInt len,FT_Fixed *weightvector)

{
  uint uVar1;
  PS_Blend pPVar2;
  FT_Fixed *pFVar3;
  FT_Fixed *pFVar4;
  FT_Error FVar5;
  FT_UInt FVar6;
  ulong uVar7;
  
  pPVar2 = face->blend;
  FVar5 = 6;
  if (pPVar2 != (PS_Blend)0x0) {
    if (weightvector == (FT_Fixed *)0x0 && len == 0) {
      uVar1 = pPVar2->num_designs;
      if ((ulong)uVar1 != 0) {
        pFVar3 = pPVar2->weight_vector;
        pFVar4 = pPVar2->default_weight_vector;
        uVar7 = 0;
        do {
          pFVar3[uVar7] = pFVar4[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
        return 0;
      }
    }
    else {
      if (weightvector == (FT_Fixed *)0x0) {
        return 6;
      }
      uVar1 = pPVar2->num_designs;
      FVar6 = len;
      if (uVar1 < len) {
        FVar6 = uVar1;
      }
      if (FVar6 == 0) {
        uVar7 = 0;
      }
      else {
        pFVar3 = pPVar2->weight_vector;
        uVar7 = 0;
        do {
          pFVar3[uVar7] = weightvector[uVar7];
          uVar7 = uVar7 + 1;
        } while (FVar6 != uVar7);
      }
      if ((uint)uVar7 < uVar1) {
        memset(pPVar2->weight_vector + (uVar7 & 0xffffffff),0,(ulong)(uVar1 + ~(uint)uVar7) * 8 + 8)
        ;
      }
      (face->root).face_flags =
           (ulong)(len != 0) << 0xf | (face->root).face_flags & 0xffffffffffff7fffU;
    }
    FVar5 = 0;
  }
  return FVar5;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_MM_WeightVector( T1_Face    face,
                          FT_UInt    len,
                          FT_Fixed*  weightvector )
  {
    PS_Blend  blend = face->blend;
    FT_UInt   i, n;


    if ( !blend )
     return FT_THROW( Invalid_Argument );

    if ( !len && !weightvector )
    {
      for ( i = 0; i < blend->num_designs; i++ )
        blend->weight_vector[i] = blend->default_weight_vector[i];
    }
    else
    {
      if ( !weightvector )
        return FT_THROW( Invalid_Argument );

      n = len < blend->num_designs ? len : blend->num_designs;

      for ( i = 0; i < n; i++ )
        blend->weight_vector[i] = weightvector[i];

      for ( ; i < blend->num_designs; i++ )
        blend->weight_vector[i] = (FT_Fixed)0;

      if ( len )
        face->root.face_flags |= FT_FACE_FLAG_VARIATION;
      else
        face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;
    }

    return FT_Err_Ok;
  }